

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRandom.h
# Opt level: O2

bool __thiscall HighsRandom::bit(HighsRandom *this)

{
  advance(this);
  return SUB81(((this->state >> 0x20) + 0x80c8963be3e4c2f3) *
               ((this->state & 0xffffffff) + 0xc8497d2a400d9551) >> 0x3f,0);
}

Assistant:

bool bit() {
    advance();
    return HighsHashHelpers::pair_hash<0>(static_cast<uint32_t>(state),
                                          state >> 32) >>
           63;
  }